

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::AddEnvOpndForInnerFrameDisplay(IRBuilder *this,Instr *instr,uint offset)

{
  bool bVar1;
  RegSlot srcRegSlot;
  RegSlot RVar2;
  JITTimeFunctionBody *this_00;
  StackSym *pSVar3;
  SymOpnd *src1Opnd;
  Instr *instr_00;
  RegOpnd *local_28;
  RegOpnd *src2Opnd;
  RegSlot envReg;
  uint offset_local;
  Instr *instr_local;
  IRBuilder *this_local;
  
  srcRegSlot = GetEnvRegForInnerFrameDisplay(this);
  if (srcRegSlot != 0xffffffff) {
    this_00 = Func::GetJITFunctionBody(this->m_func);
    RVar2 = JITTimeFunctionBody::GetLocalFrameDisplayReg(this_00);
    if (((srcRegSlot == RVar2) && (bVar1 = Func::DoStackFrameDisplay(this->m_func), bVar1)) &&
       (bVar1 = Func::IsTopFunc(this->m_func), bVar1)) {
      local_28 = IR::RegOpnd::New(TyVar,this->m_func);
      pSVar3 = Func::GetLocalFrameDisplaySym(this->m_func);
      src1Opnd = BuildFieldOpnd(this,LdSlot,(pSVar3->super_Sym).m_id,0,0xffffffff,PropertyKindSlots,
                                0xffffffff);
      instr_00 = IR::Instr::New(LdSlot,&local_28->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
      AddInstr(this,instr_00,offset);
    }
    else {
      local_28 = BuildSrcOpnd(this,srcRegSlot,TyVar);
    }
    IR::Instr::SetSrc2(instr,&local_28->super_Opnd);
  }
  return;
}

Assistant:

void
IRBuilder::AddEnvOpndForInnerFrameDisplay(IR::Instr *instr, uint offset)
{
    Js::RegSlot envReg = this->GetEnvRegForInnerFrameDisplay();
    if (envReg != Js::Constants::NoRegister)
    {
        IR::RegOpnd *src2Opnd;
        if (envReg == m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg() &&
            m_func->DoStackFrameDisplay() &&
            m_func->IsTopFunc())
        {
            src2Opnd = IR::RegOpnd::New(TyVar, m_func);
            this->AddInstr(
                IR::Instr::New(
                    Js::OpCode::LdSlot, src2Opnd,
                    this->BuildFieldOpnd(Js::OpCode::LdSlot, m_func->GetLocalFrameDisplaySym()->m_id, 0, (Js::PropertyIdIndexType)-1, PropertyKindSlots),
                    m_func),
                offset);
        }
        else
        {
            src2Opnd = this->BuildSrcOpnd(envReg);
        }
        instr->SetSrc2(src2Opnd);
    }
}